

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_fork_test.cpp
# Opt level: O2

int post_callback_test(metacall_pid pid,void *ctx)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"MetaCall post fork callback test ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,pid);
  std::endl<char,std::char_traits<char>>(poVar1);
  post_callback_fired = 1;
  return 0;
}

Assistant:

int post_callback_test(metacall_pid pid, void *ctx)
{
	(void)ctx;

	std::cout << "MetaCall post fork callback test " << (int)pid << std::endl;

	post_callback_fired = 1;

	return 0;
}